

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

shared_ptr<mocker::ast::ForStmt> __thiscall
mocker::Parser::forStmt(Parser *this,TokIter *iter,TokIter end)

{
  long lVar1;
  TokIter TVar2;
  TokenID TVar3;
  mapped_type *pmVar4;
  undefined8 extraout_RAX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<mocker::ast::ForStmt> sVar6;
  Position beg;
  Position end_00;
  GetTokenID id;
  shared_ptr<mocker::ast::Statement> stmt;
  shared_ptr<mocker::ast::Expression> update;
  shared_ptr<mocker::ast::Expression> condition;
  shared_ptr<mocker::ast::Expression> init;
  anon_class_24_2_341b408a local_58;
  element_type *local_38;
  
  Token::position(*end._M_current);
  local_58.iter = (TokIter *)end._M_current;
  TVar3 = GetTokenID::operator()(&id,*end._M_current);
  if (TVar3 != For) {
    (this->tokBeg)._M_current = (Token *)0x0;
    (this->tokEnd)._M_current = (Token *)0x0;
    _Var5._M_pi = extraout_RDX;
LAB_00172da3:
    sVar6.super___shared_ptr<mocker::ast::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var5._M_pi;
    sVar6.super___shared_ptr<mocker::ast::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<mocker::ast::ForStmt>)
           sVar6.super___shared_ptr<mocker::ast::ForStmt,_(__gnu_cxx::_Lock_policy)2>;
  }
  lVar1 = *(long *)end._M_current;
  *(long *)end._M_current = lVar1 + 0x70;
  TVar3 = GetTokenID::operator()(&id,(Token *)(lVar1 + 0x38));
  if (TVar3 == LeftParen) {
    assignmentExpr((Parser *)&init,iter,end);
    TVar2._M_current = *end._M_current;
    *(Token **)end._M_current = TVar2._M_current + 1;
    TVar3 = GetTokenID::operator()(&id,TVar2);
    if (TVar3 != Semicolon) goto LAB_00172dbf;
    assignmentExpr((Parser *)&condition,iter,end);
    TVar2._M_current = *end._M_current;
    *(Token **)end._M_current = TVar2._M_current + 1;
    TVar3 = GetTokenID::operator()(&id,TVar2);
    if (TVar3 != Semicolon) goto LAB_00172dc9;
    assignmentExpr((Parser *)&update,iter,end);
    TVar2._M_current = *end._M_current;
    *(Token **)end._M_current = TVar2._M_current + 1;
    TVar3 = GetTokenID::operator()(&id,TVar2);
    if (TVar3 == RightParen) {
      statement((Parser *)&stmt,iter,end);
      if (stmt.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        local_38 = stmt.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
        pmVar4 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)iter[2]._M_current,(key_type *)&local_38);
        beg.col = local_58.begPos.line;
        beg.line = (size_t)iter;
        end_00.col = (pmVar4->second).line;
        end_00.line = local_58.begPos.col;
        makeNode<mocker::ast::ForStmt,std::shared_ptr<mocker::ast::Expression>&,std::shared_ptr<mocker::ast::Expression>&,std::shared_ptr<mocker::ast::Expression>&,std::shared_ptr<mocker::ast::Statement>&>
                  (this,beg,end_00,(shared_ptr<mocker::ast::Expression> *)(pmVar4->second).col,&init
                   ,&condition,(shared_ptr<mocker::ast::Statement> *)&update);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&stmt.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&update.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&condition.
                    super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&init.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        _Var5._M_pi = extraout_RDX_00;
        goto LAB_00172da3;
      }
      goto LAB_00172ddd;
    }
  }
  else {
    forStmt::anon_class_24_2_341b408a::operator()(&local_58);
LAB_00172dbf:
    forStmt::anon_class_24_2_341b408a::operator()(&local_58);
LAB_00172dc9:
    forStmt::anon_class_24_2_341b408a::operator()(&local_58);
  }
  forStmt::anon_class_24_2_341b408a::operator()(&local_58);
LAB_00172ddd:
  forStmt::anon_class_24_2_341b408a::operator()(&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&stmt.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&update.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&init.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

std::shared_ptr<ast::ForStmt> Parser::forStmt(TokIter &iter, TokIter end) {
  auto begPos = iter->position().first;
  auto id = GetTokenID(end);
  auto throwError = [begPos, &iter] {
    throw SyntaxError(begPos, iter->position().second);
  };

  if (id(iter) != TokenID::For)
    return nullptr;
  ++iter;
  if (id(iter++) != TokenID::LeftParen)
    throwError();
  auto init = expression(iter, end);
  if (id(iter++) != TokenID::Semicolon)
    throwError();
  auto condition = expression(iter, end);
  if (id(iter++) != TokenID::Semicolon)
    throwError();
  auto update = expression(iter, end);
  if (id(iter++) != TokenID::RightParen)
    throwError();
  auto stmt = statement(iter, end);
  if (!stmt)
    throwError();
  return makeNode<ast::ForStmt>(begPos, pos[stmt->getID()].second, init,
                                condition, update, stmt);
}